

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cc
# Opt level: O2

int __thiscall Composite::traverse(Composite *this)

{
  int iVar1;
  pointer ppCVar2;
  int iVar3;
  int i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    ppCVar2 = (this->children).super__Vector_base<Component_*,_std::allocator<Component_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    iVar1 = this->value;
    if ((ulong)((long)(this->children).super__Vector_base<Component_*,_std::allocator<Component_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= uVar4)
    break;
    iVar3 = (**ppCVar2[uVar4]->_vptr_Component)();
    this->value = iVar3 + iVar1;
    uVar4 = uVar4 + 1;
  }
  return iVar1;
}

Assistant:

int traverse() {
    for (int i = 0; i < children.size(); i++) {
      value = value + children[i]->traverse();
    }
    return value;
  }